

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_path.c
# Opt level: O0

char * zt_find_basedir(char *path,char *trigger)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  undefined8 in_RSI;
  char *in_RDI;
  char lpath [4097];
  char cpath [4097];
  char *result;
  ssize_t offt;
  size_t len;
  stat sbuf;
  size_t in_stack_ffffffffffffdf08;
  size_t __n;
  char *str;
  ssize_t in_stack_ffffffffffffdf28;
  ssize_t in_stack_ffffffffffffdf30;
  char *in_stack_ffffffffffffdf38;
  char local_10c8 [4112];
  char *local_b8;
  ssize_t local_b0;
  ulong local_a8;
  stat local_a0;
  undefined8 local_10;
  char *local_8;
  
  local_b8 = (char *)0x0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_a8 = strlen(in_RDI);
  memset(&stack0xffffffffffffdf28,0,0x1001);
  __n = local_a8;
  if (0x1000 < local_a8) {
    __n = 0x1001;
  }
  memcpy(&stack0xffffffffffffdf28,local_8,__n);
  str = local_8;
  while( true ) {
    memset(local_10c8,0,0x1001);
    snprintf(local_10c8,0x1001,"%s%s%s",&stack0xffffffffffffdf28,"/",local_10);
    piVar2 = __errno_location();
    *piVar2 = 0;
    iVar1 = stat(local_10c8,&local_a0);
    if (iVar1 == 0) {
      local_a8 = strlen(&stack0xffffffffffffdf28);
      local_a8 = local_a8 + 2;
      local_b8 = (char *)zt_calloc_p(__n,in_stack_ffffffffffffdf08);
      snprintf(local_b8,local_a8,"%s%s",&stack0xffffffffffffdf28,"/");
      return local_b8;
    }
    sVar3 = strlen(&stack0xffffffffffffdf28);
    if (sVar3 == 0) break;
    local_b0 = zt_cstr_rfind(in_stack_ffffffffffffdf38,in_stack_ffffffffffffdf30,
                             in_stack_ffffffffffffdf28,str);
    if (local_b0 == -1) {
      return local_b8;
    }
    (&stack0xffffffffffffdf28)[local_b0] = 0;
  }
  return local_b8;
}

Assistant:

char *zt_find_basedir(const char * path, const char * trigger) {
    struct stat sbuf;
    size_t      len;
    ssize_t     offt;
    char      * result = NULL;
    char        cpath[PATH_MAX + 1];
    char        lpath[PATH_MAX + 1];

    len = strlen(path);
    memset(lpath, 0, sizeof(lpath));
    memcpy(lpath, path, MIN(len, sizeof(cpath)));

    do {
        memset(cpath, 0, sizeof(cpath));
        snprintf(cpath, sizeof(cpath), "%s%s%s", lpath, PATH_SEPERATOR, trigger);
        errno = 0;
        if (stat(cpath, &sbuf) == 0) {
            /* found it */
            len    = strlen(lpath) + strlen(PATH_SEPERATOR) + 1;
            result = zt_callocs(sizeof(char), len);
            snprintf(result, len, "%s%s", lpath, PATH_SEPERATOR);
            break;
        }

        if ((strlen(lpath) == 0) ||
            (offt = zt_cstr_rfind(lpath, 0, -1, PATH_SEPERATOR)) == -1) {
            break;
        }
        lpath[offt] = '\0';
    } while (1);

    return result;
}